

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcoluk.c
# Opt level: O1

int ffpcnuk(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,
           uint *array,uint nulvalue,int *status)

{
  tcolumn *ptVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  uint *puVar6;
  LONGLONG LVar7;
  ulong nelempar;
  long lVar8;
  long lVar9;
  LONGLONG LVar10;
  ulong nelem_00;
  
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if ((fptr->Fptr->datastart == -1) && (iVar3 = ffrdef(fptr,status), 0 < iVar3))
    goto LAB_001a832b;
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  ptVar1 = fptr->Fptr->tableptr;
  iVar3 = ptVar1[(long)colnum + -1].tdatatype;
  if (iVar3 < 1) {
    LVar7 = firstelem + nelem + -1;
  }
  else {
    LVar7 = ptVar1[(long)colnum + -1].trepeat;
  }
  if ((iVar3 < 0) && (iVar4 = ffpcluk(fptr,colnum,firstrow,firstelem,nelem,array,status), 0 < iVar4)
     ) {
    if (*status != 0x19c) {
      return *status;
    }
    *status = 0;
  }
  lVar8 = (firstrow + -1) * LVar7 + firstelem;
  bVar2 = 0;
  if (nelem < 1) {
    nelem_00 = 0;
    nelempar = 0;
    nelem = 0;
  }
  else {
    bVar2 = 0;
    nelempar = 0;
    nelem_00 = 0;
    puVar6 = array;
    lVar9 = lVar8;
    LVar10 = nelem;
    do {
      if (*puVar6 == nulvalue) {
        if ((nelem_00 != 0 && 0 < iVar3) &&
           (lVar5 = (long)(~nelem_00 + lVar9) / LVar7,
           iVar4 = ffpcluk(fptr,colnum,lVar5 + 1,(-LVar7 * lVar5 - nelem_00) + lVar9,nelem_00,
                           puVar6 + -nelem_00,status), 0 < iVar4)) {
          if (*status != 0x19c) {
            return *status;
          }
          *status = 0;
          bVar2 = 1;
        }
        nelempar = nelempar + 1;
        nelem_00 = 0;
      }
      else {
        if ((nelempar != 0) &&
           (lVar5 = (long)(~nelempar + lVar9) / LVar7,
           iVar4 = ffpclu(fptr,colnum,lVar5 + 1,(-LVar7 * lVar5 - nelempar) + lVar9,nelempar,status)
           , 0 < iVar4)) goto LAB_001a832b;
        nelem_00 = nelem_00 + 1;
        nelempar = 0;
      }
      puVar6 = puVar6 + 1;
      lVar9 = lVar9 + 1;
      LVar10 = LVar10 + -1;
    } while (LVar10 != 0);
  }
  if (nelem_00 == 0) {
    if (nelempar != 0) {
      lVar9 = (long)((nelem - nelempar) + lVar8 + -1) / LVar7;
      ffpclu(fptr,colnum,lVar9 + 1,((nelem - nelempar) + lVar8) - lVar9 * LVar7,nelempar,status);
    }
  }
  else if (0 < iVar3) {
    lVar5 = nelem - nelem_00;
    lVar9 = (lVar5 + lVar8 + -1) / LVar7;
    ffpcluk(fptr,colnum,lVar9 + 1,(lVar5 + lVar8) - LVar7 * lVar9,nelem_00,array + lVar5,status);
  }
  if ((bool)(*status < 1 & bVar2)) {
    *status = 0x19c;
  }
LAB_001a832b:
  return *status;
}

Assistant:

int ffpcnuk(fitsfile *fptr,  /* I - FITS file pointer                       */
            int  colnum,     /* I - number of column to write (1 = 1st col) */
            LONGLONG  firstrow,  /* I - first row to write (1 = 1st row)        */
            LONGLONG  firstelem, /* I - first vector element to write (1 = 1st) */
            LONGLONG  nelem,     /* I - number of values to write               */
   unsigned int   *array,    /* I - array of values to write                */
   unsigned int    nulvalue, /* I - value used to flag undefined pixels     */
            int  *status)    /* IO - error status                           */
/*
  Write an array of elements to the specified column of a table.  Any input
  pixels equal to the value of nulvalue will be replaced by the appropriate
  null value in the output FITS file. 

  The input array of values will be converted to the datatype of the column 
  and will be inverse-scaled by the FITS TSCALn and TZEROn values if necessary
*/
{
    tcolumn *colptr;
    LONGLONG  ngood = 0, nbad = 0, ii;
    LONGLONG repeat, first, fstelm, fstrow;
    int tcode, overflow = 0;

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    }
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
    {
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);
    }

    colptr  = (fptr->Fptr)->tableptr;   /* point to first column */
    colptr += (colnum - 1);     /* offset to correct column structure */

    tcode  = colptr->tdatatype;

    if (tcode > 0)
       repeat = colptr->trepeat;  /* repeat count for this column */
    else
       repeat = firstelem -1 + nelem;  /* variable length arrays */

    /* if variable length array, first write the whole input vector, 
       then go back and fill in the nulls */
    if (tcode < 0) {
      if (ffpcluk(fptr, colnum, firstrow, firstelem, nelem, array, status) > 0) {
        if (*status == NUM_OVERFLOW) 
	{
	  /* ignore overflows, which are possibly the null pixel values */
	  /*  overflow = 1;   */
	  *status = 0;
	} else { 
          return(*status);
	}
      }
    }

    /* absolute element number in the column */
    first = (firstrow - 1) * repeat + firstelem;

    for (ii = 0; ii < nelem; ii++)
    {
      if (array[ii] != nulvalue)  /* is this a good pixel? */
      {
         if (nbad)  /* write previous string of bad pixels */
         {
            fstelm = ii - nbad + first;  /* absolute element number */
            fstrow = (fstelm - 1) / repeat + 1;  /* starting row number */
            fstelm = fstelm - (fstrow - 1) * repeat;  /* relative number */

            if (ffpclu(fptr, colnum, fstrow, fstelm, nbad, status) > 0)
                return(*status);

            nbad=0;
         }

         ngood = ngood +1;  /* the consecutive number of good pixels */
      }
      else
      {
         if (ngood)  /* write previous string of good pixels */
         {
            fstelm = ii - ngood + first;  /* absolute element number */
            fstrow = (fstelm - 1) / repeat + 1;  /* starting row number */
            fstelm = fstelm - (fstrow - 1) * repeat;  /* relative number */

            if (tcode > 0) {  /* variable length arrays have already been written */
              if (ffpcluk(fptr, colnum, fstrow, fstelm, ngood, &array[ii-ngood],
                status) > 0) {
		if (*status == NUM_OVERFLOW) 
		{
		  overflow = 1;
		  *status = 0;
		} else { 
                  return(*status);
		}
	      }
	    }
            ngood=0;
         }

         nbad = nbad +1;  /* the consecutive number of bad pixels */
      }
    }

    /* finished loop;  now just write the last set of pixels */

    if (ngood)  /* write last string of good pixels */
    {
      fstelm = ii - ngood + first;  /* absolute element number */
      fstrow = (fstelm - 1) / repeat + 1;  /* starting row number */
      fstelm = fstelm - (fstrow - 1) * repeat;  /* relative number */

      if (tcode > 0) {  /* variable length arrays have already been written */
        ffpcluk(fptr, colnum, fstrow, fstelm, ngood, &array[ii-ngood], status);
      }
    }
    else if (nbad) /* write last string of bad pixels */
    {
      fstelm = ii - nbad + first;  /* absolute element number */
      fstrow = (fstelm - 1) / repeat + 1;  /* starting row number */
      fstelm = fstelm - (fstrow - 1) * repeat;  /* relative number */

      ffpclu(fptr, colnum, fstrow, fstelm, nbad, status);
    }

    if (*status <= 0) {
      if (overflow) {
        *status = NUM_OVERFLOW;
      }
    }

    return(*status);
}